

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_def.c
# Opt level: O2

int Connect_Fields(FORM *form,FIELD **fields)

{
  short sVar1;
  FIELD *pFVar2;
  _PAGE *p_Var3;
  int *piVar4;
  _PAGE *p_Var5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  short sVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  FIELD *pFVar13;
  uint uVar14;
  FIELD *pFVar15;
  FIELD *pFVar16;
  long lVar17;
  int iVar18;
  
  form->field = fields;
  form->maxfield = 0;
  form->maxpage = 0;
  if (fields == (FIELD **)0x0) {
    iVar18 = 0;
  }
  else {
    iVar18 = -4;
    iVar10 = 0;
    for (lVar17 = 0; pFVar13 = fields[lVar17], pFVar13 != (FIELD *)0x0; lVar17 = lVar17 + 1) {
      if (pFVar13->form != (formnode *)0x0) goto LAB_0042265c;
      if ((lVar17 == 0) || ((pFVar13->status & 4) != 0)) {
        iVar10 = iVar10 + 1;
      }
      pFVar13->form = form;
    }
    if (lVar17 == 0) {
      iVar18 = -2;
    }
    else {
      p_Var3 = (_PAGE *)malloc((long)iVar10 << 3);
      if (p_Var3 == (_PAGE *)0x0) {
        iVar18 = -1;
      }
      else {
        form->page = p_Var3;
        uVar11 = (uint)(ushort)form->rows;
        uVar12 = (uint)(ushort)form->cols;
        p_Var5 = p_Var3;
        for (lVar7 = 0; lVar17 != lVar7; lVar7 = lVar7 + 1) {
          if (lVar7 == 0) {
            p_Var5->pmin = 0;
            pFVar13 = *fields;
          }
          else {
            pFVar13 = fields[lVar7];
            if ((pFVar13->status & 4) != 0) {
              p_Var5->pmax = (short)lVar7 + -1;
              p_Var5[1].pmin = (short)lVar7;
              p_Var5 = p_Var5 + 1;
            }
          }
          uVar14 = (int)pFVar13->rows + (int)pFVar13->frow;
          sVar9 = pFVar13->fcol;
          sVar1 = pFVar13->cols;
          if ((int)(short)uVar11 < (int)uVar14) {
            form->rows = (short)uVar14;
            uVar11 = uVar14;
          }
          uVar14 = (int)sVar1 + (int)sVar9;
          if ((int)(short)uVar12 < (int)uVar14) {
            form->cols = (short)uVar14;
            uVar12 = uVar14;
          }
        }
        p_Var5->pmax = (short)lVar17 + -1;
        form->maxfield = (short)lVar17;
        sVar9 = (short)iVar10;
        form->maxpage = sVar9;
        iVar18 = 0;
        uVar6 = (ulong)(uint)(int)sVar9;
        if (sVar9 < 1) {
          uVar6 = 0;
        }
        for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
          sVar9 = p_Var3[uVar8].pmax;
          pFVar13 = (FIELD *)0x0;
          for (lVar17 = (long)p_Var3[uVar8].pmin; lVar17 <= sVar9; lVar17 = lVar17 + 1) {
            pFVar2 = fields[lVar17];
            pFVar2->index = (short)lVar17;
            pFVar2->page = (short)uVar8;
            if (pFVar13 == (FIELD *)0x0) {
              pFVar2->sprev = pFVar2;
              pFVar2->snext = pFVar2;
            }
            else {
              pFVar15 = pFVar13;
              do {
                if ((pFVar2->frow <= pFVar15->frow) &&
                   ((pFVar16 = pFVar13, pFVar15->frow != pFVar2->frow ||
                    (pFVar2->fcol <= pFVar15->fcol)))) goto LAB_0042260e;
                pFVar15 = pFVar15->snext;
              } while (pFVar15 != pFVar13);
              pFVar16 = (FIELD *)0x0;
LAB_0042260e:
              pFVar2->snext = pFVar15;
              pFVar2->sprev = pFVar15->sprev;
              pFVar15->sprev = pFVar2;
              pFVar2->sprev->snext = pFVar2;
              if (pFVar15 != pFVar16) {
                pFVar2 = pFVar13;
              }
            }
            pFVar13 = pFVar2;
          }
          p_Var3[uVar8].smin = pFVar13->index;
          p_Var3[uVar8].smax = pFVar13->sprev->index;
        }
      }
    }
  }
LAB_0042265c:
  piVar4 = __errno_location();
  *piVar4 = iVar18;
  return iVar18;
}

Assistant:

static int Connect_Fields(FORM  * form, FIELD ** fields)
{
  int field_cnt, j;
  int page_nr;
  int maximum_row_in_field, maximum_col_in_field;
  _PAGE *pg;
  
  assert(form != 0);

  form->field    = fields;
  form->maxfield = 0;
  form->maxpage  = 0;

  if (!fields)
    RETURN(E_OK);
  
  page_nr = 0;
  /* store formpointer in fields and count pages */
  for(field_cnt=0;fields[field_cnt];field_cnt++)
    {
      if (fields[field_cnt]->form) 
	RETURN(E_CONNECTED);
      if ( field_cnt==0 || 
	  (fields[field_cnt]->status & _NEWPAGE)) 
	page_nr++;
      fields[field_cnt]->form = form;
    }	
  if (field_cnt==0)
    RETURN(E_BAD_ARGUMENT);
  
  /* allocate page structures */
  if ( (pg = (_PAGE *)malloc(page_nr * sizeof(_PAGE))) != (_PAGE *)0 )
    {
      form->page = pg;
    }
  else
    RETURN(E_SYSTEM_ERROR);
  
  /* Cycle through fields and calculate page boundaries as well as
     size of the form */
  for(j=0;j<field_cnt;j++)
    {
      if (j==0) 
	pg->pmin = j;
      else
	{
	  if (fields[j]->status & _NEWPAGE)
	    {
	      pg->pmax = j-1;
	      pg++;
	      pg->pmin = j;
	    }
	}
      
      maximum_row_in_field = fields[j]->frow + fields[j]->rows;
      maximum_col_in_field = fields[j]->fcol + fields[j]->cols;
      
      if (form->rows < maximum_row_in_field) 
	form->rows = maximum_row_in_field;
      if (form->cols < maximum_col_in_field) 
	form->cols = maximum_col_in_field;
    }
  
  pg->pmax       = field_cnt-1;
  form->maxfield = field_cnt;
  form->maxpage  = page_nr; 
  
  /* Sort fields on form pages */
  for(page_nr = 0;page_nr < form->maxpage; page_nr++)
    {
      FIELD *fld = (FIELD *)0;
      for(j = form->page[page_nr].pmin;j <= form->page[page_nr].pmax;j++)
	{
	  fields[j]->index = j;
	  fields[j]->page  = page_nr;
	  fld = Insert_Field_By_Position(fields[j],fld);
	}
      form->page[page_nr].smin = fld->index;
      form->page[page_nr].smax = fld->sprev->index;
    }
  RETURN(E_OK);
}